

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteComment(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *content_local;
  xmlTextWriterPtr writer_local;
  
  iVar1 = xmlTextWriterStartComment(writer);
  if (iVar1 < 0) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar2 = xmlTextWriterWriteString(writer,content);
    if (iVar2 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar3 = xmlTextWriterEndComment(writer);
      if (iVar3 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        writer_local._4_4_ = iVar3 + iVar2 + iVar1;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteComment(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;

    DEBUG_ENTER(("xmlTextWriterWriteComment(%p, %s);\n", writer, content));

    sum = 0;
    count = xmlTextWriterStartComment(writer);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;
    count = xmlTextWriterEndComment(writer);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;

    RETURN_INT(sum);
}